

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O2

void __thiscall bidirectional::BiDirectional::checkCriticalRes(BiDirectional *this)

{
  element_type *peVar1;
  pointer pdVar2;
  source_loc loc;
  logger *this_00;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  string_view_t fmt;
  int local_24;
  char *local_20;
  undefined4 uStack_18;
  undefined4 uStack_14;
  char *local_10;
  
  peVar1 = (this->best_label_).super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  pdVar2 = (peVar1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  dVar5 = INFINITY;
  uVar3 = 0;
  for (uVar4 = 0;
      (long)(peVar1->resource_consumption).super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != uVar4;
      uVar4 = uVar4 + 1) {
    dVar6 = (this->max_res).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] - pdVar2[uVar4];
    if (dVar6 < dVar5) {
      uVar3 = uVar4 & 0xffffffff;
      dVar5 = dVar6;
    }
  }
  local_24 = (int)uVar3;
  if (local_24 !=
      ((this->params_ptr_)._M_t.
       super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>.
       _M_t.
       super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>.
       super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->critical_res) {
    this_00 = spdlog::default_logger_raw();
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/torressa[P]cspy/src/cc/bidirectional.cc";
    uStack_18 = 0x44;
    local_10 = "checkCriticalRes";
    loc._12_4_ = uStack_14;
    loc.line = 0x44;
    loc.filename = 
    "/workspace/llm4binary/github/license_c_cmakelists/torressa[P]cspy/src/cc/bidirectional.cc";
    loc.funcname = "checkCriticalRes";
    fmt.size_ = 0x34;
    fmt.data_ = "Critical resource {} does not match final tighest {}";
    spdlog::logger::log_<int&,int&>
              (this_00,loc,warn,fmt,
               &((this->params_ptr_)._M_t.
                 super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
                 .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl)->critical_res,
               &local_24);
  }
  return;
}

Assistant:

void BiDirectional::checkCriticalRes() const {
  const std::vector<double>& res      = best_label_->resource_consumption;
  double                     min_diff = std::numeric_limits<double>::infinity();
  int                        min_r    = 0;
  for (int r = 0; r < res.size(); r++) {
    const double& diff = max_res[r] - res[r];
    if (diff < min_diff) {
      min_diff = diff;
      min_r    = r;
    }
  }
  if (min_r != params_ptr_->critical_res)
    SPDLOG_WARN(
        "Critical resource {} does not match final tighest {}",
        params_ptr_->critical_res,
        min_r);
}